

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.c
# Opt level: O0

_Bool art_iterator_up(art_iterator_t *iterator)

{
  art_node_t *paVar1;
  art_iterator_t *in_RDI;
  bool bVar2;
  
  bVar2 = in_RDI->frame != '\0';
  if (bVar2) {
    in_RDI->frame = in_RDI->frame + 0xff;
    paVar1 = art_iterator_node(in_RDI);
    in_RDI->depth = in_RDI->depth - ((char)paVar1[1] + '\x01');
  }
  return bVar2;
}

Assistant:

static bool art_iterator_up(art_iterator_t *iterator) {
    if (iterator->frame == 0) {
        return false;
    }
    iterator->frame--;
    // We went up, so we are at an inner node.
    iterator->depth -=
        ((art_inner_node_t *)art_iterator_node(iterator))->prefix_size + 1;
    return true;
}